

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleColorNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Text *this_00;
  aiLight *paVar2;
  bool bVar3;
  Property *pPVar4;
  DataArrayList *pDVar5;
  Value *pVVar6;
  int iVar7;
  char *pKey;
  aiMaterial *this_01;
  undefined8 local_60;
  ai_real local_58;
  ai_real local_54;
  ai_real local_50;
  ai_real local_4c;
  string local_48;
  
  if (node == (DDLNode *)0x0) {
    return;
  }
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"attrib","");
  pPVar4 = ODDLParser::DDLNode::findPropertyByName(node,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT26(local_48.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_48.field_2._M_allocated_capacity._4_2_,
                                      local_48.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (pPVar4 == (Property *)0x0) {
    return;
  }
  if (pPVar4->m_value == (Value *)0x0) {
    return;
  }
  pDVar5 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar5 == (DataArrayList *)0x0) {
    return;
  }
  local_60 = 0;
  local_58 = 0.0;
  if (pDVar5->m_numItems == 4) {
    pVVar6 = pDVar5->m_dataList;
    local_50 = ODDLParser::Value::getFloat(pVVar6);
    pVVar6 = ODDLParser::Value::getNext(pVVar6);
    local_54 = ODDLParser::Value::getFloat(pVVar6);
    pVVar6 = ODDLParser::Value::getNext(pVVar6);
    local_4c = ODDLParser::Value::getFloat(pVVar6);
    pVVar6 = ODDLParser::Value::getNext(pVVar6);
    ODDLParser::Value::getFloat(pVVar6);
    local_58 = local_4c;
  }
  else {
    if (pDVar5->m_numItems != 3) {
      __assert_fail("4 == colList->m_numItems",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x3d2,"void Assimp::OpenGEX::getColorRGB4(aiColor4D *, DataArrayList *)");
    }
    pVVar6 = pDVar5->m_dataList;
    local_50 = ODDLParser::Value::getFloat(pVVar6);
    pVVar6 = ODDLParser::Value::getNext(pVVar6);
    local_54 = ODDLParser::Value::getFloat(pVVar6);
    pVVar6 = ODDLParser::Value::getNext(pVVar6);
    local_58 = ODDLParser::Value::getFloat(pVVar6);
  }
  local_60._0_4_ = local_50;
  local_60._4_4_ = local_54;
  this_00 = pPVar4->m_key;
  if (this_00 == (Text *)0x0) {
    iVar7 = 0;
  }
  else {
    bVar3 = ODDLParser::Text::operator==(this_00,(string *)Grammar::DiffuseColorToken_abi_cxx11_);
    iVar7 = 1;
    if (!bVar3) {
      bVar3 = ODDLParser::Text::operator==(this_00,(string *)Grammar::SpecularColorToken_abi_cxx11_)
      ;
      iVar7 = 2;
      if (!bVar3) {
        bVar3 = ODDLParser::Text::operator==
                          (this_00,(string *)Grammar::EmissionColorToken_abi_cxx11_);
        iVar7 = 3;
        if (!bVar3) {
          local_48.field_2._M_allocated_capacity._0_4_ = 0x6867696c;
          local_48.field_2._M_allocated_capacity._4_2_ = 0x74;
          local_48._M_string_length = 5;
          local_48._M_dataplus._M_p = (pointer)paVar1;
          bVar3 = ODDLParser::Text::operator==(this_00,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,
                            CONCAT26(local_48.field_2._M_allocated_capacity._6_2_,
                                     CONCAT24(local_48.field_2._M_allocated_capacity._4_2_,
                                              local_48.field_2._M_allocated_capacity._0_4_)) + 1);
          }
          iVar7 = (uint)bVar3 << 2;
        }
      }
    }
  }
  switch(iVar7) {
  case 1:
    this_01 = this->m_currentMaterial;
    pKey = "$clr.diffuse";
    break;
  case 2:
    this_01 = this->m_currentMaterial;
    pKey = "$clr.specular";
    break;
  case 3:
    this_01 = this->m_currentMaterial;
    pKey = "$clr.emissive";
    break;
  case 4:
    paVar2 = this->m_currentLight;
    (paVar2->mColorDiffuse).r = (ai_real)local_60;
    (paVar2->mColorDiffuse).g = local_60._4_4_;
    (paVar2->mColorDiffuse).b = local_58;
  default:
    goto switchD_004c8eff_default;
  }
  aiMaterial::AddBinaryProperty(this_01,&local_60,0xc,pKey,0,0,aiPTI_Float);
switchD_004c8eff_default:
  return;
}

Assistant:

void OpenGEXImporter::handleColorNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            DataArrayList *colList( node->getDataArrayList() );
            if( nullptr == colList ) {
                return;
            }
            aiColor3D col;
            if ( 3 == colList->m_numItems ) {
                aiColor3D col3;
                getColorRGB3( &col3, colList );
                col = col3;
            } else {
                aiColor4D col4;
                getColorRGB4( &col4, colList );
                col.r = col4.r;
                col.g = col4.g;
                col.b = col4.b;
            }
#ifdef ASSIMP_USE_HUNTER
            const ColorType colType( getColorType( &prop->m_key->m_text ) );
#else
            const ColorType colType( getColorType( prop->m_key ) );
#endif
            if( DiffuseColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_DIFFUSE );
            } else if( SpecularColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_SPECULAR );
            } else if( EmissionColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_EMISSIVE );
            } else if ( LightColor == colType ) {
                m_currentLight->mColorDiffuse = col;
            }
        }
    }
}